

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O1

void __thiscall pbrt::syntactic::Medium::Medium(Medium *this,string *type)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  
  p_Var1 = &(this->super_ParamSet).param._M_t._M_impl.super__Rb_tree_header;
  (this->super_ParamSet).param._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->super_ParamSet).param._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->super_ParamSet).param._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->super_ParamSet).param._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->super_ParamSet).param._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->type)._M_dataplus._M_p = (pointer)&(this->type).field_2;
  pcVar2 = (type->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->type,pcVar2,pcVar2 + type->_M_string_length);
  return;
}

Assistant:

Medium(const std::string &type) : type(type) {}